

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall
AmpIO::GetWriteData(AmpIO *this,quadlet_t *buf,uint offset,uint numQuads,bool doSwap)

{
  uint uVar1;
  ostream *poVar2;
  void *this_00;
  __uint32_t local_44;
  ulong local_38;
  size_t i;
  uint WriteBufSize;
  bool doSwap_local;
  uint numQuads_local;
  uint offset_local;
  quadlet_t *buf_local;
  AmpIO *this_local;
  
  uVar1 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[3])();
  if (uVar1 >> 2 < offset + numQuads) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"AmpIO:GetWriteData: invalid args: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,offset);
    poVar2 = std::operator<<(poVar2,", ");
    this_00 = (void *)std::ostream::operator<<(poVar2,numQuads);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    for (local_38 = 0; local_38 < numQuads; local_38 = local_38 + 1) {
      if (doSwap) {
        local_44 = __bswap_32(this->WriteBuffer[offset + local_38]);
      }
      else {
        local_44 = this->WriteBuffer[offset + local_38];
      }
      buf[local_38] = local_44;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::GetWriteData(quadlet_t *buf, unsigned int offset, unsigned int numQuads, bool doSwap) const
{
    unsigned int WriteBufSize = GetWriteNumBytes() / sizeof(quadlet_t);
    if ((offset+numQuads) > WriteBufSize) {
        std::cerr << "AmpIO:GetWriteData: invalid args: " << offset << ", " << numQuads << std::endl;
        return false;
    }

    for (size_t i = 0; i < numQuads; i++)
        buf[i] = doSwap ? bswap_32(WriteBuffer[offset+i]) : WriteBuffer[offset+i];
    return true;
}